

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v10::detail::
for_each_codepoint<fmt::v10::detail::compute_width(fmt::v10::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  detail *begin;
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  anon_class_8_1_54a39806 decode;
  char buf [7];
  count_code_points local_38;
  char local_30 [8];
  
  local_38.count = (size_t *)s.size_;
  pcVar3 = s.data_;
  begin = this;
  if (pcVar3 < (char *)0x4) {
LAB_0017c639:
    lVar2 = (long)(this + (long)pcVar3) - (long)begin;
    if (lVar2 != 0) {
      local_30[4] = '\0';
      local_30[5] = '\0';
      local_30[6] = '\0';
      local_30[0] = '\0';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      copy_str<char,_const_char,_char,_0>((char *)begin,(char *)(begin + lVar2),local_30);
      pcVar3 = local_30;
      do {
        pcVar1 = for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                           ((anon_class_8_1_54a39806 *)&local_38,pcVar3,(char *)begin);
        if (pcVar1 == (char *)0x0) {
          return;
        }
        begin = begin + ((long)pcVar1 - (long)pcVar3);
        pcVar3 = pcVar1;
      } while ((long)pcVar1 - (long)local_30 < lVar2);
    }
  }
  else {
    do {
      if (this + (long)pcVar3 + -3 <= begin) goto LAB_0017c639;
      begin = (detail *)
              for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                        ((anon_class_8_1_54a39806 *)&local_38,(char *)begin,(char *)begin);
    } while (begin != (detail *)0x0);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, error ? 1 : to_unsigned(end - buf_ptr)));
    return result ? (error ? buf_ptr + 1 : end) : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}